

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O2

Allocation * __thiscall
density::detail::
SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)0>
          (Allocation *__return_storage_ptr__,
          SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  void *pvVar1;
  ControlBlock *i_tail;
  uintptr_t uVar2;
  uintptr_t uint_pointer;
  uintptr_t start_uint_pointer;
  ulong i_size_00;
  uintptr_t end_uint_pointer;
  ControlBlock *i_atomic;
  size_t i_alignment_00;
  unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_> lock;
  
  if (7 < i_control_bits) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0xba);
  }
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0xbb);
  }
  i_alignment_00 = 8;
  if (8 < i_alignment) {
    i_alignment_00 = i_alignment;
  }
  i_size_00 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    i_size_00 = i_size;
  }
  lock._M_device = &this->m_mutex;
  lock._M_owns = false;
  std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::lock(&lock);
  i_tail = this->m_tail;
  while( true ) {
    if (i_tail == (ControlBlock *)0x0 || ((ulong)i_tail & 0x3f) != 0) {
      density_tests::detail::assert_failed<>
                ("tail != nullptr && address_is_aligned(tail, s_alloc_granularity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
                 ,0xd2);
    }
    pvVar1 = address_upper_align((void *)((long)&i_tail->m_next + ((ulong)i_include_type << 4 | 8)),
                                 i_alignment_00);
    i_atomic = (ControlBlock *)(i_size_00 + 0x3f + (long)pvVar1 & 0xffffffffffffffc0);
    if ((long)i_atomic - ((ulong)i_tail & 0xffffffffffff0000) < 0xffc1) break;
    if (0xffa8 < (i_alignment_00 + i_size_00) - 8) {
      std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::unlock(&lock);
      LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
      ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)0>
                (__return_storage_ptr__,
                 (LFQueue_Base<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::detail::SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
                  *)this,i_control_bits,i_size_00,i_alignment_00);
LAB_00f7b87f:
      std::unique_lock<density::detail::SpinlockMutex<density::default_busy_wait>_>::~unique_lock
                (&lock);
      return __return_storage_ptr__;
    }
    i_tail = page_overflow(this,LfQueue_Throwing,i_tail);
    this->m_tail = i_tail;
  }
  raw_atomic_store((uintptr_t *)i_atomic,0,memory_order_seq_cst);
  uVar2 = raw_atomic_load(&i_tail->m_next,memory_order_seq_cst);
  if (uVar2 != 0) {
    density_tests::detail::assert_failed<>
              ("raw_atomic_load(&control_block->m_next, mem_relaxed) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0xf1);
  }
  uVar2 = (long)&i_atomic->m_next + i_control_bits;
  raw_atomic_store(&i_tail->m_next,uVar2,memory_order_seq_cst);
  if ((ControlBlock *)((ulong)i_tail & 0xffffffffffff0000 | 0xffc0) <= i_tail) {
    density_tests::detail::assert_failed<>
              ("control_block < get_end_control_block(tail)",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0xf4);
  }
  this->m_tail = i_atomic;
  __return_storage_ptr__->m_control_block = i_tail;
  __return_storage_ptr__->m_next_ptr = uVar2;
  __return_storage_ptr__->m_user_storage = pvVar1;
  goto LAB_00f7b87f;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                std::unique_lock<decltype(m_mutex)> lock(m_mutex, std::defer_lock);
                if (guarantee == LfQueue_Throwing || guarantee == LfQueue_Blocking)
                {
                    lock.lock();
                }
                else
                {
                    if (!lock.try_lock())
                        return Allocation{};
                }

                auto tail = m_tail;
                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      tail != nullptr && address_is_aligned(tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    void * address = address_add(
                      tail, i_include_type ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate space for the element
                    address                   = address_upper_align(address, i_alignment);
                    void * const user_storage = address;
                    address                   = address_add(address, i_size);
                    address                   = address_upper_align(address, s_alloc_granularity);
                    auto const new_tail       = static_cast<ControlBlock *>(address);

                    // check for page overflow
                    auto const new_tail_offset = address_diff(
                      new_tail, address_lower_align(tail, ALLOCATOR_TYPE::page_alignment));
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* note: while control_block->m_next is zero, no consumers may ever read this
                        variable. So this does not need to be atomic store. */
                        //new_tail->m_next = 0;
                        /* edit: clang5 thread sanitizer has reported a data race between this write and the read:
                        auto const next_uint = raw_atomic_load(&control->m_next, mem_relaxed);
                        in start_consume_impl (detail\lf_queue_head_multiple.h).
                        Making the store atomic.... */
                        raw_atomic_store(&new_tail->m_next, uintptr_t(0));

                        auto const control_block = tail;
                        auto const next_ptr =
                          reinterpret_cast<uintptr_t>(new_tail) + i_control_bits;
                        DENSITY_ASSERT_INTERNAL(
                          raw_atomic_load(&control_block->m_next, mem_relaxed) == 0);
                        raw_atomic_store(&control_block->m_next, next_ptr, mem_release);

                        DENSITY_ASSERT_INTERNAL(control_block < get_end_control_block(tail));
                        m_tail = new_tail;
                        return {control_block, next_ptr, user_storage};
                    }
                    else if (
                      i_size + (i_alignment - min_alignment) <=
                      s_max_size_inpage) // if this allocation may fit in a page
                    {
                        tail = page_overflow(PROGRESS_GUARANTEE, tail);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (tail == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            DENSITY_ASSUME(tail != 0);
                        }
                        m_tail = tail;
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        lock.unlock(); // this avoids recursive locks
                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          i_control_bits, i_size, i_alignment);
                    }
                }
            }